

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

void __thiscall
level_mesh::merge(level_mesh *this,b_model_instance *instance,b_model_instance *instance1)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pbVar6;
  long lVar7;
  
  uVar3 = instance1->max_face;
  pbVar6 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (ulong)instance1->min_face * 0x40;
  if (pbVar6 + instance1->min_face != pbVar6 + (ulong)uVar3 + 1) {
    uVar4 = instance1->tag;
    uVar5 = instance->tag;
    do {
      if (*(uint32_t *)((long)&pbVar6->tag + lVar7) == uVar4) {
        *(uint32_t *)((long)&pbVar6->tag + lVar7) = uVar5;
      }
      lVar7 = lVar7 + 0x40;
    } while ((ulong)uVar3 * 0x40 + 0x40 != lVar7);
  }
  fVar2 = (instance1->aabb).field_0.field_1.x1;
  if (fVar2 < (instance->aabb).field_0.field_1.x1) {
    (instance->aabb).field_0.field_1.x1 = fVar2;
  }
  fVar2 = (instance1->aabb).field_0.field_1.y1;
  if (fVar2 < (instance->aabb).field_0.field_1.y1) {
    (instance->aabb).field_0.field_1.y1 = fVar2;
  }
  fVar2 = (instance1->aabb).field_0.field_1.z1;
  if (fVar2 < (instance->aabb).field_0.field_1.z1) {
    (instance->aabb).field_0.field_1.z1 = fVar2;
  }
  fVar2 = (instance1->aabb).field_0.field_1.x2;
  pfVar1 = &(instance->aabb).field_0.field_1.x2;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (instance->aabb).field_0.field_1.x2 = fVar2;
  }
  fVar2 = (instance1->aabb).field_0.field_1.y2;
  pfVar1 = &(instance->aabb).field_0.field_1.y2;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (instance->aabb).field_0.field_1.y2 = fVar2;
  }
  fVar2 = (instance1->aabb).field_0.field_1.z2;
  pfVar1 = &(instance->aabb).field_0.field_1.z2;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (instance->aabb).field_0.field_1.z2 = fVar2;
  }
  if (instance1->min_vert < instance->min_vert) {
    instance->min_vert = instance1->min_vert;
  }
  if (instance->max_vert < instance1->max_vert) {
    instance->max_vert = instance1->max_vert;
  }
  if (instance1->min_face < instance->min_face) {
    instance->min_face = instance1->min_face;
  }
  if (instance->max_face < instance1->max_face) {
    instance->max_face = instance1->max_face;
  }
  instance->num_faces = instance->num_faces + instance1->num_faces;
  return;
}

Assistant:

void level_mesh::merge(b_model_instance* instance, const b_model_instance* instance1)
{
	change_tag(instance1->tag, instance1->min_face, instance1->max_face, instance->tag);
	instance->aabb.merge(instance1->aabb);
	if (instance->min_vert > instance1->min_vert)
		instance->min_vert = instance1->min_vert;
	if (instance->max_vert < instance1->max_vert)
		instance->max_vert = instance1->max_vert;
	if (instance->min_face > instance1->min_face)
		instance->min_face = instance1->min_face;
	if (instance->max_face < instance1->max_face)
		instance->max_face = instance1->max_face;
	instance->num_faces += instance1->num_faces;
}